

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InternalException::InternalException<long,long>
          (InternalException *this,string *msg,long params,long params_1)

{
  long in_RCX;
  string *in_RDX;
  InternalException *in_RDI;
  string *in_stack_ffffffffffffff98;
  string local_40 [24];
  long in_stack_ffffffffffffffd8;
  
  Exception::ConstructMessage<long,long>(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  InternalException(in_RDI,in_stack_ffffffffffffff98);
  ::std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}